

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feebumper.h
# Opt level: O3

void __thiscall
wallet::feebumper::SignatureWeights::AddSigWeight
          (SignatureWeights *this,size_t weight,SigVersion sigversion)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (sigversion == BASE) {
    weight = weight << 2;
    sigversion = 4;
  }
  else if (sigversion != WITNESS_V0) {
    if (sigversion - TAPROOT < 2) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/feebumper.h"
                    ,0x5f,
                    "void wallet::feebumper::SignatureWeights::AddSigWeight(const size_t, const SigVersion)"
                   );
    }
    goto LAB_007bd2e9;
  }
  this->m_sigs_weight = this->m_sigs_weight + weight;
  this->m_sigs_count = this->m_sigs_count + sigversion;
LAB_007bd2e9:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddSigWeight(const size_t weight, const SigVersion sigversion)
    {
        switch (sigversion) {
        case SigVersion::BASE:
            m_sigs_weight += weight * WITNESS_SCALE_FACTOR;
            m_sigs_count += 1 * WITNESS_SCALE_FACTOR;
            break;
        case SigVersion::WITNESS_V0:
            m_sigs_weight += weight;
            m_sigs_count++;
            break;
        case SigVersion::TAPROOT:
        case SigVersion::TAPSCRIPT:
            assert(false);
        }
    }